

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveData.cpp
# Opt level: O0

size_t __thiscall CDirectiveData::getUnitSize(CDirectiveData *this)

{
  CDirectiveData *this_local;
  
  switch(this->mode) {
  case Invalid:
  default:
    this_local = (CDirectiveData *)0x0;
    break;
  case U8:
  case Ascii:
  case Sjis:
  case Custom:
    this_local = (CDirectiveData *)0x1;
    break;
  case U16:
    this_local = (CDirectiveData *)0x2;
    break;
  case U32:
  case Float:
    this_local = (CDirectiveData *)0x4;
    break;
  case U64:
  case Double:
    this_local = (CDirectiveData *)0x8;
  }
  return (size_t)this_local;
}

Assistant:

size_t CDirectiveData::getUnitSize() const
{
	switch (mode)
	{
	case EncodingMode::U8:
	case EncodingMode::Ascii:
	case EncodingMode::Sjis:
	case EncodingMode::Custom:
		return 1;
	case EncodingMode::U16:
		return 2;
	case EncodingMode::U32:
	case EncodingMode::Float:
		return 4;
	case EncodingMode::U64:
	case EncodingMode::Double:
		return 8;
	case EncodingMode::Invalid:
		break;
	}

	return 0;
}